

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Plat_RaiseAndStayTx0
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  EPlatType type;
  
  if (arg3 == 1) {
    type = platRaiseAndStay;
  }
  else if (arg3 == 2) {
    type = platRaiseAndStayLockout;
  }
  else {
    type = (uint)(gameinfo.gametype == GAME_Heretic) * 4 + platRaiseAndStay;
  }
  bVar1 = EV_DoPlat(arg0,ln,type,0.0,(double)arg1 * 0.125,0,0,1);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Plat_RaiseAndStayTx0)
// Plat_RaiseAndStayTx0 (tag, speed, lockout)
{
	DPlat::EPlatType type;

	switch (arg3)
	{
		case 1:
			type = DPlat::platRaiseAndStay;
			break;
		case 2:
			type = DPlat::platRaiseAndStayLockout;
			break;
		default:
			type = gameinfo.gametype == GAME_Heretic? DPlat::platRaiseAndStayLockout : DPlat::platRaiseAndStay;
			break;
	}


	return EV_DoPlat (arg0, ln, type, 0, SPEED(arg1), 0, 0, 1);
}